

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ehooks.h
# Opt level: O0

_Bool ehooks_purge_lazy(tsdn_t *tsdn,ehooks_t *ehooks,void *addr,size_t size,size_t offset,
                       size_t length)

{
  code *pcVar1;
  byte bVar2;
  uint uVar3;
  extent_hooks_t *peVar4;
  undefined8 in_RCX;
  tsdn_t *in_RDX;
  ehooks_t *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  _Bool err;
  extent_hooks_t *extent_hooks;
  size_t in_stack_ffffffffffffff88;
  tsdn_t *in_stack_ffffffffffffff90;
  _Bool local_1;
  
  peVar4 = ehooks_get_extent_hooks_ptr(in_RSI);
  if (peVar4 == &duckdb_je_ehooks_default_extent_hooks) {
    local_1 = duckdb_je_ehooks_default_purge_lazy_impl
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0x251d923);
  }
  else if (peVar4->purge_lazy == (undefined1 *)0x0) {
    local_1 = true;
  }
  else {
    ehooks_pre_reentrancy(in_stack_ffffffffffffff90);
    pcVar1 = (code *)peVar4->purge_lazy;
    uVar3 = ehooks_ind_get(in_RSI);
    bVar2 = (*pcVar1)(peVar4,in_RDX,in_RCX,in_R8,in_R9,uVar3);
    local_1 = (_Bool)(bVar2 & 1);
    ehooks_post_reentrancy(in_RDX);
  }
  return local_1;
}

Assistant:

static inline bool
ehooks_purge_lazy(tsdn_t *tsdn, ehooks_t *ehooks, void *addr, size_t size,
    size_t offset, size_t length) {
	extent_hooks_t *extent_hooks = ehooks_get_extent_hooks_ptr(ehooks);
#ifdef PAGES_CAN_PURGE_LAZY
	if (extent_hooks == &ehooks_default_extent_hooks) {
		return ehooks_default_purge_lazy_impl(addr, offset, length);
	}
#endif
	if (extent_hooks->purge_lazy == NULL) {
		return true;
	} else {
		ehooks_pre_reentrancy(tsdn);
		bool err = extent_hooks->purge_lazy(extent_hooks, addr, size,
		    offset, length, ehooks_ind_get(ehooks));
		ehooks_post_reentrancy(tsdn);
		return err;
	}
}